

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

size_t __thiscall features::Sift::extrema_detection(Sift *this,ConstPtr *s,int oi,int si)

{
  float fVar1;
  float fVar2;
  int iVar3;
  element_type *peVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int i;
  ulong uVar11;
  int x;
  long lVar12;
  int iVar13;
  uint local_78 [2];
  int noff [9];
  Keypoint kp;
  
  peVar4 = s[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  noff[5] = (peVar4->super_TypedImageBase<float>).super_ImageBase.w;
  lVar8 = (long)noff[5];
  iVar3 = (peVar4->super_TypedImageBase<float>).super_ImageBase.h;
  local_78[0] = ~noff[5];
  local_78[1] = -noff[5];
  iVar10 = 1;
  noff[0] = 1 - noff[5];
  noff[1] = -1;
  noff[2] = 0;
  noff[3] = 1;
  noff[4] = (int)(lVar8 + -1);
  noff[6] = noff[5] + 1;
  iVar13 = 0;
  lVar9 = lVar8;
  do {
    if (iVar3 + -1 <= iVar10) {
      return (long)iVar13;
    }
    for (lVar12 = 1; lVar12 < lVar8 + -1; lVar12 = lVar12 + 1) {
      fVar1 = ((s[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->super_TypedImageBase<float>).data.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar9 + lVar12];
      bVar6 = true;
      uVar7 = 0;
      bVar5 = true;
LAB_00116ba5:
      if (bVar6) {
        if (2 < uVar7) goto LAB_00116c28;
LAB_00116bbe:
        for (uVar11 = 0; ((bVar6 || (bVar5)) && (uVar11 < 9)); uVar11 = uVar11 + 1) {
          if (uVar11 != 4 || uVar7 != 1) {
            fVar2 = ((s[uVar7].
                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_TypedImageBase<float>).data.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9 + lVar12 + (long)(int)local_78[uVar11]];
            if (fVar1 <= fVar2) {
              bVar6 = false;
            }
            if (fVar2 <= fVar1) {
              bVar5 = false;
            }
          }
        }
        uVar7 = uVar7 + 1;
        goto LAB_00116ba5;
      }
      if ((bVar5) && (uVar7 < 3)) goto LAB_00116bbe;
      if (!bVar5 && !bVar6) goto LAB_00116c5c;
LAB_00116c28:
      noff[7] = oi;
      noff[8] = (int)(float)si;
      std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::push_back
                (&this->keypoints,(value_type *)(noff + 7));
      iVar13 = iVar13 + 1;
LAB_00116c5c:
    }
    iVar10 = iVar10 + 1;
    lVar9 = lVar9 + lVar8;
  } while( true );
}

Assistant:

std::size_t
Sift::extrema_detection (core::FloatImage::ConstPtr s[3], int oi, int si)
{
    int const w = s[1]->width();
    int const h = s[1]->height();

    /* Offsets for the 9-neighborhood w.r.t. center pixel. */
    int noff[9] = { -1 - w, 0 - w, 1 - w, -1, 0, 1, -1 + w, 0 + w, 1 + w };

    /*
     * Iterate over all pixels in s[1], and check if pixel is maximum
     * (or minumum) in its 27-neighborhood.
     */
    int detected = 0;
    int off = w;
    for (int y = 1; y < h - 1; ++y, off += w)
        for (int x = 1; x < w - 1; ++x)
        {
            int idx = off + x;

            bool largest = true;
            bool smallest = true;
            float center_value = s[1]->at(idx);
            for (int l = 0; (largest || smallest) && l < 3; ++l)
                for (int i = 0; (largest || smallest) && i < 9; ++i)
                {
                    if (l == 1 && i == 4) // Skip center pixel
                        continue;
                    if (s[l]->at(idx + noff[i]) >= center_value)
                        largest = false;
                    if (s[l]->at(idx + noff[i]) <= center_value)
                        smallest = false;
                }

            /* Skip non-maximum values. */
            if (!smallest && !largest)
                continue;

            /* Yummy. Add detected scale space extremum. */
            Keypoint kp;
            kp.octave = oi;
            kp.x = static_cast<float>(x);
            kp.y = static_cast<float>(y);
            kp.sample = static_cast<float>(si);
            this->keypoints.push_back(kp);
            detected += 1;
        }

    return detected;
}